

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFUsedFont.cpp
# Opt level: O3

bool __thiscall
PDFUsedFont::IOutlineEnumerator::Curveto
          (IOutlineEnumerator *this,FT_Short x1,FT_Short y1,FT_Short x2,FT_Short y2,FT_Short x3,
          FT_Short y3)

{
  double dVar1;
  double dVar2;
  int iVar3;
  undefined2 in_register_0000000a;
  undefined2 in_register_00000012;
  undefined2 in_register_00000032;
  undefined2 in_register_00000082;
  undefined2 in_register_0000008a;
  double dVar4;
  
  dVar4 = this->mFontScale / (double)(int)(short)(this->super_IOutlineEnumerator).mUPM;
  dVar1 = this->mBase_x;
  dVar2 = this->mBase_y;
  iVar3 = (*(this->super_IOutlineEnumerator)._vptr_IOutlineEnumerator[8])
                    ((double)CONCAT22(in_register_00000032,x1) * dVar4 + dVar1,
                     (double)CONCAT22(in_register_00000012,y1) * dVar4 + dVar2,
                     (double)CONCAT22(in_register_0000000a,x2) * dVar4 + dVar1,
                     (double)CONCAT22(in_register_00000082,y2) * dVar4 + dVar2,
                     (double)CONCAT22(in_register_0000008a,x3) * dVar4 + dVar1,
                     (double)(int)y3 * dVar4 + dVar2);
  return SUB41(iVar3,0);
}

Assistant:

bool PDFUsedFont::IOutlineEnumerator::Curveto(FT_Short x1, FT_Short y1, FT_Short x2, FT_Short y2, FT_Short x3, FT_Short y3)
{
	double scale = mFontScale / UPM();
	return Curveto(mBase_x + scale * x1, mBase_y + scale * y1,
	               mBase_x + scale * x2, mBase_y + scale * y2,
	               mBase_x + scale * x3, mBase_y + scale * y3);
}